

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O3

void assert_correct_relation_between_relops<mark_negative,ak_toolkit::markable_ns::order_by_value>
               (markable<mark_negative,_ak_toolkit::markable_ns::order_by_value> *a,
               markable<mark_negative,_ak_toolkit::markable_ns::order_by_value> *b)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  uVar1 = a->_storage;
  uVar2 = b->_storage;
  bVar5 = (int)uVar2 < 0;
  if ((int)uVar1 >= 0) {
    bVar5 = uVar1 == uVar2;
  }
  bVar7 = (int)uVar1 < 0;
  if (-1 < (int)uVar2) {
    bVar7 = uVar1 == uVar2;
  }
  if (bVar5 != bVar7) {
    __assert_fail("(a == b) == (b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fa,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar3 = -1 < (int)uVar2;
  if (-1 < (int)uVar1) {
    bVar3 = uVar1 != uVar2;
  }
  bVar6 = -1 < (int)uVar1;
  if (-1 < (int)uVar2) {
    bVar6 = uVar1 != uVar2;
  }
  if (bVar3 != bVar6) {
    __assert_fail("(a != b) == (b != a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fb,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if (bVar5 == bVar3) {
    __assert_fail("(a != b) == !(a == b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fc,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if (bVar7 == bVar6) {
    __assert_fail("(b != a) == !(b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fd,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if ((int)uVar2 < 0) {
    if (-1 < (int)uVar1) {
      bVar7 = false;
      if (uVar1 == uVar2) goto LAB_0010588a;
      goto LAB_00105642;
    }
    bVar5 = true;
    bVar7 = true;
    if (-1 < (int)uVar2) goto LAB_001057ef;
LAB_001056ba:
    uVar4 = 0;
    if (bVar7 != bVar5) {
LAB_0010580e:
      __assert_fail("(a <= b) == ((a < b) || (a == b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x205,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
  }
  else {
    bVar8 = (int)uVar1 < 0;
    bVar6 = uVar2 <= uVar1;
    if (bVar6 && !bVar8 == bVar8) {
      __assert_fail("(a < b) == !(a >= b)",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x200,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    if (bVar6 && !bVar8) {
      bVar7 = uVar1 == uVar2;
    }
    else {
      bVar7 = false;
      if (bVar5 != false) {
LAB_0010588a:
        __assert_fail("(a == b) == (a >= b && a <= b)",
                      "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                      ,0x203,
                      "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                     );
      }
    }
    bVar5 = false;
    if (bVar6 && !bVar8) {
LAB_00105642:
      bVar5 = uVar1 <= uVar2 && -1 < (int)uVar2;
    }
    if (bVar5 != bVar7) {
LAB_001057ef:
      __assert_fail("(a == b) == (!(a < b) && !(a > b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x204,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    bVar5 = (int)uVar1 < 0 || uVar1 <= uVar2 && -1 < (int)uVar2;
    if ((int)uVar2 < 0) goto LAB_001056ba;
    if (uVar1 < uVar2 || (int)uVar1 < 0) {
      if ((int)uVar1 >= 0 && (uVar1 > uVar2 || -1 >= (int)uVar2)) goto LAB_0010580e;
    }
    else if (bVar7 != bVar5) goto LAB_0010580e;
    uVar4 = (uint)(uVar1 < uVar2 || (int)uVar1 < 0);
  }
  if ((int)uVar1 < 0) {
    if (uVar4 != ~uVar2 >> 0x1f) goto LAB_0010582d;
    if ((int)uVar2 < 0) {
      return;
    }
  }
  else {
    if (uVar2 < uVar1 || (int)uVar2 < 0) {
      if (uVar4 != 0) {
LAB_0010582d:
        __assert_fail("(a < b) == (!(a > b) && !(a == b))",
                      "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                      ,0x206,
                      "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                     );
      }
    }
    else if (uVar4 != (uVar1 != uVar2)) goto LAB_0010582d;
    if ((uVar1 != uVar2) == (uVar2 < uVar1 || (int)uVar2 < 0)) {
      if ((int)uVar2 < 0) goto LAB_00105759;
    }
    else if (((int)uVar2 < 0) || (uVar2 <= uVar1)) {
      __assert_fail("(a != b) == (a > b) || (b > a)",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x207,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    if (-1 < (int)uVar1 && uVar2 <= uVar1) {
      return;
    }
  }
  if (bVar3 == false) {
    __assert_fail("a != b",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x209,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
LAB_00105759:
  if (((uVar2 == uVar1) && (-1 < (int)uVar1)) && ((int)uVar2 < 0 || uVar2 < uVar1)) {
    __assert_fail("a != b",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x20a,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  return;
}

Assistant:

void assert_correct_relation_between_relops
  (markable<MP, OP> const& a, markable<MP, OP> const& b)
{
  assert( (a == b) ==  (b == a) );
  assert( (a != b) ==  (b != a) );
  assert( (a != b) == !(a == b) );
  assert( (b != a) == !(b == a) );

  assert( (a < b) == (b > a) );
  assert( (a < b) == !(a >= b) );
  assert( (a < b) == !(b <= a) );

  assert( (a == b) == (a >= b && a <= b) );
  assert( (a == b) == (!(a < b) && !(a > b)) );
  assert( (a <= b) == ((a < b) || (a == b)) );
  assert( (a < b) == (!(a > b) && !(a == b)) );
  assert( (a != b) == (a > b) || (b > a) );

  if (a < b) assert(a != b);
  if (a > b) assert(a != b);
}